

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O3

void __thiscall Bstrlib::String::Repeat(String *this,int count)

{
  int iVar1;
  int len;
  
  iVar1 = (this->super_tagbstring).slen;
  len = count * iVar1;
  if (len < 1) {
    if (0 < iVar1) {
      (this->super_tagbstring).slen = 0;
      *(this->super_tagbstring).data = '\0';
    }
  }
  else {
    iVar1 = bpattern(&this->super_tagbstring,len);
    if (iVar1 == -1) {
      Repeat();
    }
  }
  return;
}

Assistant:

void String::Repeat(int count)
    {
        count *= slen;
        if (count <= 0)
        {
            Truncate(0);
            return;
        }
        if (BSTR_ERR == bpattern(this, count))    bstringThrow("Failure in repeat");
    }